

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int firLowpassFilter(StkFrames *src,StkFrames *dst,double stopband,double initial_value)

{
  StkFloat *pSVar1;
  int i_1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  int i;
  uint uVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  Convolution conv;
  double input [16384];
  double coeff [16384];
  Convolution CStack_40078;
  double adStack_40038 [16384];
  double adStack_20038 [16385];
  
  for (lVar8 = 0; lVar8 != 0x4000; lVar8 = lVar8 + 1) {
    dVar9 = (double)((int)lVar8 + -0x2000);
    dVar10 = cos((dVar9 * 0.0001220703125 + 1.0) * 3.141592653589793);
    dVar9 = dVar9 * stopband;
    dVar11 = 1.0;
    if ((dVar9 != 0.0) || (NAN(dVar9))) {
      dVar11 = sin(dVar9 * 3.141592653589793);
      dVar11 = dVar11 / (dVar9 * 3.141592653589793);
    }
    adStack_20038[lVar8] = (dVar10 * -0.46 + 0.54) * dVar11 * stopband;
  }
  Convolution::Convolution(&CStack_40078,0x4000,adStack_20038);
  for (lVar8 = 0; lVar8 != 0x4000; lVar8 = lVar8 + 1) {
    adStack_40038[lVar8] = initial_value;
  }
  Convolution::convolve(&CStack_40078,adStack_40038,0x4000);
  uVar5 = 0;
  for (uVar7 = 0xffffe000; iVar3 = (int)src->size_, (int)uVar7 < iVar3; uVar7 = uVar7 + 0x4000) {
    uVar4 = iVar3 - uVar5;
    if (0x3fff < (int)uVar4) {
      uVar4 = 0x4000;
    }
    if ((int)uVar4 < 1) {
      uVar4 = 0;
    }
    uVar6 = (ulong)uVar4;
    pSVar1 = src->data_;
    for (uVar2 = 0; uVar6 != uVar2; uVar2 = uVar2 + 1) {
      adStack_40038[uVar2] = pSVar1[uVar5 + uVar2];
    }
    for (; uVar6 != 0x4000; uVar6 = uVar6 + 1) {
      adStack_40038[uVar6] = 0.0;
    }
    Convolution::convolve(&CStack_40078,adStack_40038,0x4000);
    pSVar1 = dst->data_;
    for (lVar8 = 0; lVar8 != 0x4000; lVar8 = lVar8 + 1) {
      iVar3 = (int)((ulong)uVar7 + lVar8);
      if ((-1 < iVar3) && (iVar3 < (int)src->size_)) {
        pSVar1[(ulong)uVar7 + lVar8 & 0xffffffff] = adStack_40038[lVar8];
      }
    }
    uVar5 = uVar4 + uVar5;
  }
  Convolution::~Convolution(&CStack_40078);
  return iVar3;
}

Assistant:

int firLowpassFilter(const stk::StkFrames &src,
					 stk::StkFrames &dst,
					 double stopband,
					 double initial_value)
{
	int		half_window_len = filter_window_len / 2;
	double	coeff[filter_window_len];
	double	input[filter_window_len];
	
	// フィルタ作成
	for (int i=0; i<filter_window_len; ++i) {
		double	x = i - half_window_len;
		double	window_x = x/half_window_len + 1.0;
		double	window = 0.54 - 0.46 * std::cos(M_PI * window_x);
		coeff[i] = sinc(x * stopband) * window * stopband;
	}
	
	Convolution conv(filter_window_len, coeff);

	// initial_valueの反映
	for (int i=0; i<filter_window_len; ++i) {
		input[i] = initial_value;
	}
	conv.convolve(input, filter_window_len);
	
	int src_index = 0;
	int dst_index = -half_window_len;
	
	while (dst_index < static_cast<int>(src.size())) {
		int input_len = static_cast<int>(src.size()) - src_index;
		if (input_len > filter_window_len) {
			input_len = filter_window_len;
		}
		if (input_len < 0) {
			input_len = 0;
		}
		for (int i=0; i<input_len; ++i) {
			input[i] = src[src_index + i];
		}
		for (int i=input_len; i<filter_window_len; ++i) {
			input[i] = 0;
		}
		conv.convolve(input, filter_window_len);
		src_index += input_len;
		
		for (int i=0; i<filter_window_len; ++i) {
			if ((dst_index >= 0) && (dst_index < static_cast<int>(src.size()))) {
				dst[dst_index] = input[i];
			}
			dst_index++;
		}
	}

	return (int)src.size();
}